

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O0

void __thiscall Fifteen::setTiles(Fifteen *this)

{
  BoardMode BVar1;
  pointer this_00;
  BoardMode mode;
  Fifteen *this_local;
  
  this_00 = std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->
                      (&this->controller);
  BVar1 = Controller::getBoardMode(this_00);
  if (BVar1 == NUMERIC) {
    setTilesNumeric(this);
  }
  else {
    setTilesGraphic(this);
  }
  return;
}

Assistant:

void Fifteen::setTiles()
{
    BoardMode mode = controller->getBoardMode();
    if ( mode == BoardMode::NUMERIC )
    {
        setTilesNumeric();
    }
    else
    {
        setTilesGraphic();
    }
}